

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O2

void __thiscall
aeron::concurrent::AtomicBuffer::AtomicBuffer(AtomicBuffer *this,uint8_t *buffer,size_t length)

{
  OutOfBoundsException *this_00;
  char *pcVar1;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  this->_vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016f200;
  this->m_buffer = buffer;
  this->m_length = (length_t)length;
  if ((length & 0xffffffff80000000) != 0) {
    this_00 = (OutOfBoundsException *)__cxa_allocate_exception(0x48);
    util::strPrintf_abi_cxx11_(&local_40,"length out of bounds[%p]: length=%lld",this,length);
    std::__cxx11::string::string
              ((string *)&local_60,
               "aeron::concurrent::AtomicBuffer::AtomicBuffer(std::uint8_t *, size_t)",&local_81);
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/AtomicBuffer.h"
                              );
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_82);
    util::OutOfBoundsException::OutOfBoundsException(this_00,&local_40,&local_60,&local_80,0x3d);
    __cxa_throw(this_00,&util::OutOfBoundsException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  return;
}

Assistant:

AtomicBuffer(std::uint8_t *buffer, size_t length) :
        m_buffer(buffer),
        m_length(static_cast<util::index_t>(length))
    {
#if !defined(DISABLE_BOUNDS_CHECKS)
        if (AERON_COND_EXPECT(length > std::numeric_limits<util::index_t>::max(), true))
        {
            throw aeron::util::OutOfBoundsException(
                aeron::util::strPrintf("length out of bounds[%p]: length=%lld", this, static_cast<long long>(length)),
                SOURCEINFO);
        }
#endif
    }